

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *
__thiscall
wallet::LegacyDataSPKM::GetScriptPubKeys
          (unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
           *__return_storage_ptr__,LegacyDataSPKM *this)

{
  _Base_ptr *scriptPubKey;
  bool bVar1;
  int iVar2;
  TxoutType TVar3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witprog;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  sols;
  int wit_ver;
  unique_lock<std::recursive_mutex> local_120;
  PKHash local_10c;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_f8;
  undefined1 local_b0;
  direct_or_indirect local_a8;
  direct_or_indirect local_80 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_120,
             &(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x6a9,false);
  std::
  _Hashtable<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h);
  for (p_Var4 = (this->super_FillableSigningProvider).mapKeys._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var4 !=
      &(this->super_FillableSigningProvider).mapKeys._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    CKey::GetPubKey((CPubKey *)&local_80[0].indirect_contents,(CKey *)&p_Var4[1]._M_right);
    GetScriptForRawPubKey((CScript *)&local_f8._M_first,(CPubKey *)&local_80[0].indirect_contents);
    std::__detail::
    _Insert<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)__return_storage_ptr__,(value_type *)&local_f8._M_first);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_f8._M_first);
    PKHash::PKHash(&local_10c,(CPubKey *)&local_80[0].indirect_contents);
    local_f8._M_first._M_storage._M_storage[0x10] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10];
    local_f8._M_first._M_storage._M_storage[0x11] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11];
    local_f8._M_first._M_storage._M_storage[0x12] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12];
    local_f8._M_first._M_storage._M_storage[0x13] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13];
    local_f8._M_first._M_storage._M_storage[0] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0];
    local_f8._M_first._M_storage._M_storage[1] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1];
    local_f8._M_first._M_storage._M_storage[2] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2];
    local_f8._M_first._M_storage._M_storage[3] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3];
    local_f8._M_first._M_storage._M_storage[4] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4];
    local_f8._M_first._M_storage._M_storage[5] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5];
    local_f8._M_first._M_storage._M_storage[6] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6];
    local_f8._M_first._M_storage._M_storage[7] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7];
    local_f8._M_first._M_storage._M_storage[8] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8];
    local_f8._M_first._M_storage._M_storage[9] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9];
    local_f8._M_first._M_storage._M_storage[10] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10];
    local_f8._M_first._M_storage._M_storage[0xb] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb];
    local_f8._M_first._M_storage._M_storage[0xc] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc];
    local_f8._M_first._M_storage._M_storage[0xd] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd];
    local_f8._M_first._M_storage._M_storage[0xe] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe];
    local_f8._M_first._M_storage._M_storage[0xf] =
         local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf];
    local_b0 = 2;
    GetScriptForDestination
              ((CScript *)&local_a8.indirect_contents,(CTxDestination *)&local_f8._M_first);
    std::__detail::
    _Insert<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)__return_storage_ptr__,(value_type *)&local_a8.indirect_contents);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_a8.indirect_contents);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_f8._M_first);
  }
  for (p_Var4 = (this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    GetScriptForRawPubKey((CScript *)&local_f8._M_first,(CPubKey *)&p_Var4[1]._M_right);
    std::__detail::
    _Insert<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)__return_storage_ptr__,(value_type *)&local_f8._M_first);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_f8._M_first);
    PKHash::PKHash((PKHash *)&local_a8.indirect_contents,(CPubKey *)&p_Var4[1]._M_right);
    local_f8._16_4_ = local_a8._16_4_;
    local_f8._0_8_ = local_a8.indirect_contents.indirect;
    local_f8._8_8_ = local_a8._8_8_;
    local_b0 = 2;
    GetScriptForDestination
              ((CScript *)&local_80[0].indirect_contents,(CTxDestination *)&local_f8._M_first);
    std::__detail::
    _Insert<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)__return_storage_ptr__,(value_type *)&local_80[0].indirect_contents);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_80[0].indirect_contents);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&local_f8._M_first);
  }
  for (p_Var4 = (this->super_FillableSigningProvider).mapScripts._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left;
      (_Rb_tree_header *)p_Var4 !=
      &(this->super_FillableSigningProvider).mapScripts._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    scriptPubKey = &p_Var4[1]._M_right;
    iVar2 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[3])(this,scriptPubKey);
    if (iVar2 == 2) {
      bVar1 = CScript::IsPayToScriptHash((CScript *)scriptPubKey);
      if (!bVar1) {
        ScriptHash::ScriptHash((ScriptHash *)&local_a8.indirect_contents,(CScript *)scriptPubKey);
        local_f8._16_4_ = local_a8._16_4_;
        local_f8._0_8_ = local_a8.indirect_contents.indirect;
        local_f8._8_8_ = local_a8._8_8_;
        local_b0 = 3;
        GetScriptForDestination
                  ((CScript *)&local_80[0].indirect_contents,(CTxDestination *)&local_f8._M_first);
        std::__detail::
        _Insert<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
        ::insert((_Insert<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                  *)__return_storage_ptr__,(value_type *)&local_80[0].indirect_contents);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   &local_80[0].indirect_contents);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8._M_first);
      }
      local_80[0]._0_4_ = -1;
      local_f8._0_8_ = 0;
      local_f8._8_8_ = 0;
      local_f8._16_8_ = 0;
      bVar1 = CScript::IsWitnessProgram
                        ((CScript *)scriptPubKey,(int *)local_80[0].direct,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8._M_first
                        );
      if (bVar1 && local_80[0]._0_4_ == 0) {
        std::__detail::
        _Insert_base<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)__return_storage_ptr__,(value_type *)scriptPubKey);
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8._M_first);
    }
    else {
      local_a8.indirect_contents.indirect = (char *)0x0;
      local_a8._8_8_ = 0;
      local_a8._16_8_ = 0;
      TVar3 = Solver((CScript *)scriptPubKey,
                     (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&local_a8.indirect_contents);
      if (TVar3 == MULTISIG) {
        ScriptHash::ScriptHash((ScriptHash *)&local_10c,(CScript *)scriptPubKey);
        local_f8._M_first._M_storage._M_storage[0x10] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x10];
        local_f8._M_first._M_storage._M_storage[0x11] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x11];
        local_f8._M_first._M_storage._M_storage[0x12] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x12];
        local_f8._M_first._M_storage._M_storage[0x13] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0x13];
        local_f8._M_first._M_storage._M_storage[0] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0];
        local_f8._M_first._M_storage._M_storage[1] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[1];
        local_f8._M_first._M_storage._M_storage[2] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[2];
        local_f8._M_first._M_storage._M_storage[3] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[3];
        local_f8._M_first._M_storage._M_storage[4] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[4];
        local_f8._M_first._M_storage._M_storage[5] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[5];
        local_f8._M_first._M_storage._M_storage[6] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[6];
        local_f8._M_first._M_storage._M_storage[7] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[7];
        local_f8._M_first._M_storage._M_storage[8] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[8];
        local_f8._M_first._M_storage._M_storage[9] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[9];
        local_f8._M_first._M_storage._M_storage[10] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[10];
        local_f8._M_first._M_storage._M_storage[0xb] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xb];
        local_f8._M_first._M_storage._M_storage[0xc] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xc];
        local_f8._M_first._M_storage._M_storage[0xd] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xd];
        local_f8._M_first._M_storage._M_storage[0xe] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xe];
        local_f8._M_first._M_storage._M_storage[0xf] =
             local_10c.super_BaseHash<uint160>.m_hash.super_base_blob<160U>.m_data._M_elems[0xf];
        local_b0 = 3;
        GetScriptForDestination
                  ((CScript *)&local_80[0].indirect_contents,(CTxDestination *)&local_f8._M_first);
        std::__detail::__variant::
        _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                             *)&local_f8._M_first);
        iVar2 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[3])(this,local_80);
        if (iVar2 != 0) {
          std::__detail::
          _Insert_base<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::insert((_Insert_base<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)__return_storage_ptr__,(value_type *)&local_80[0].indirect_contents);
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                   &local_80[0].indirect_contents);
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)&local_a8.indirect_contents);
    }
  }
  for (p_Var4 = (this->setWatchOnly)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->setWatchOnly)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
    iVar2 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[3])(this,p_Var4 + 1);
    if (iVar2 != 0) {
      std::__detail::
      _Insert_base<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)__return_storage_ptr__,(value_type *)(p_Var4 + 1));
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_120);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::unordered_set<CScript, SaltedSipHasher> LegacyDataSPKM::GetScriptPubKeys() const
{
    LOCK(cs_KeyStore);
    std::unordered_set<CScript, SaltedSipHasher> spks;

    // All keys have at least P2PK and P2PKH
    for (const auto& key_pair : mapKeys) {
        const CPubKey& pub = key_pair.second.GetPubKey();
        spks.insert(GetScriptForRawPubKey(pub));
        spks.insert(GetScriptForDestination(PKHash(pub)));
    }
    for (const auto& key_pair : mapCryptedKeys) {
        const CPubKey& pub = key_pair.second.first;
        spks.insert(GetScriptForRawPubKey(pub));
        spks.insert(GetScriptForDestination(PKHash(pub)));
    }

    // For every script in mapScript, only the ISMINE_SPENDABLE ones are being tracked.
    // The watchonly ones will be in setWatchOnly which we deal with later
    // For all keys, if they have segwit scripts, those scripts will end up in mapScripts
    for (const auto& script_pair : mapScripts) {
        const CScript& script = script_pair.second;
        if (IsMine(script) == ISMINE_SPENDABLE) {
            // Add ScriptHash for scripts that are not already P2SH
            if (!script.IsPayToScriptHash()) {
                spks.insert(GetScriptForDestination(ScriptHash(script)));
            }
            // For segwit scripts, we only consider them spendable if we have the segwit spk
            int wit_ver = -1;
            std::vector<unsigned char> witprog;
            if (script.IsWitnessProgram(wit_ver, witprog) && wit_ver == 0) {
                spks.insert(script);
            }
        } else {
            // Multisigs are special. They don't show up as ISMINE_SPENDABLE unless they are in a P2SH
            // So check the P2SH of a multisig to see if we should insert it
            std::vector<std::vector<unsigned char>> sols;
            TxoutType type = Solver(script, sols);
            if (type == TxoutType::MULTISIG) {
                CScript ms_spk = GetScriptForDestination(ScriptHash(script));
                if (IsMine(ms_spk) != ISMINE_NO) {
                    spks.insert(ms_spk);
                }
            }
        }
    }

    // All watchonly scripts are raw
    for (const CScript& script : setWatchOnly) {
        // As the legacy wallet allowed to import any script, we need to verify the validity here.
        // LegacyScriptPubKeyMan::IsMine() return 'ISMINE_NO' for invalid or not watched scripts (IsMineResult::INVALID or IsMineResult::NO).
        // e.g. a "sh(sh(pkh()))" which legacy wallets allowed to import!.
        if (IsMine(script) != ISMINE_NO) spks.insert(script);
    }

    return spks;
}